

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangular.cpp
# Opt level: O2

double __thiscall Rectangular::coordinateY(Rectangular *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  
  dVar2 = (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
  (this->super_Parameterization).x = dVar2;
  dVar1 = (this->super_Parameterization).radius;
  dVar1 = dVar1 * dVar1 - dVar2 * dVar2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  (this->super_Parameterization).y_lb = -dVar1;
  (this->super_Parameterization).y_ub = dVar1;
  dVar2 = (dVar1 + dVar1) / (double)((this->super_Parameterization).Kmax + -1);
  (this->super_Parameterization).dy = dVar2;
  return (double)K * dVar2 - dVar1;
}

Assistant:

double Rectangular::coordinateY(int J, int K, int L, int G) {
  x = x_lb + (double)J * dx;

  y_lb = -sqrt(radius * radius - x * x);
  y_ub = -y_lb;

  dy = (y_ub - y_lb) / (double)(Kmax - 1);

  return y_lb + (double)K * dy;
}